

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

bool __thiscall
CLIntercept::checkRelaxAllocationLimitsSupport
          (CLIntercept *this,cl_uint numDevices,cl_device_id *deviceList)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  byte bVar5;
  bool bVar6;
  cl_uint deviceVendorId;
  cl_device_type deviceType;
  int local_44;
  ulong local_40;
  long local_38;
  
  if (numDevices == 0) {
    return true;
  }
  local_38 = (ulong)numDevices - 1;
  bVar5 = 1;
  uVar3 = 0;
  lVar4 = 0;
  do {
    local_40 = 0;
    uVar1 = (*(this->m_Dispatch).clGetDeviceInfo)
                      (deviceList[lVar4],0x1000,8,&local_40,(size_t *)0x0);
    uVar2 = (*(this->m_Dispatch).clGetDeviceInfo)
                      (deviceList[lVar4],0x1001,4,&local_44,(size_t *)0x0);
    uVar3 = uVar3 | uVar1 | uVar2;
    if (local_44 != 0x8086 || (local_40 & 4) == 0) {
      bVar5 = 0;
      break;
    }
    bVar6 = local_38 != lVar4;
    lVar4 = lVar4 + 1;
  } while (bVar6);
  return (bool)(uVar3 == 0 & bVar5);
}

Assistant:

bool CLIntercept::checkRelaxAllocationLimitsSupport(
    cl_uint numDevices,
    const cl_device_id* deviceList ) const
{
    cl_int  errorCode = CL_SUCCESS;
    bool    supported = true;

    // For now, check for Intel GPU devices to determine whether relaxed
    // allocations are supported.  Eventually this can be checked using
    // formal mechanisms.

    for( cl_uint i = 0; i < numDevices; i++ )
    {
        cl_device_type  deviceType = 0;
        cl_uint deviceVendorId;

        errorCode |= dispatch().clGetDeviceInfo(
            deviceList[ i ],
            CL_DEVICE_TYPE,
            sizeof( deviceType ),
            &deviceType,
            NULL );
        errorCode |= dispatch().clGetDeviceInfo(
            deviceList[ i ],
            CL_DEVICE_VENDOR_ID,
            sizeof( deviceVendorId ),
            &deviceVendorId,
            NULL );
        if( ( deviceType & CL_DEVICE_TYPE_GPU ) == 0 ||
            deviceVendorId != 0x8086 )
        {
            supported = false;
            break;
        }
    }

    return ( errorCode == CL_SUCCESS ) && supported;
}